

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O1

int __thiscall
TPZSparseBlockDiagonal<long_double>::Substitution
          (TPZSparseBlockDiagonal<long_double> *this,TPZFMatrix<long_double> *B)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  TPZFNMatrix<1000,_long_double> BG;
  longdouble *local_3f68;
  TPZFMatrix<long_double> local_3f58;
  longdouble local_3ec8 [1001];
  
  lVar1 = (this->fBlock).fNElements;
  lVar2 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  local_3f58.fElem = local_3ec8;
  local_3f58.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3f58.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3f58.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01885910;
  local_3f58.fSize = 1000;
  local_3f68 = (longdouble *)0x0;
  local_3f58.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = lVar1;
  local_3f58.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = lVar2;
  local_3f58.fGiven = local_3f58.fElem;
  TPZVec<int>::TPZVec(&local_3f58.fPivot.super_TPZVec<int>,0);
  local_3f58.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_3f58.fPivot.super_TPZVec<int>.fStore = local_3f58.fPivot.fExtAlloc;
  local_3f58.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3f58.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3f58.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_3f58.fWork.fStore = (longdouble *)0x0;
  local_3f58.fWork.fNElements = 0;
  local_3f58.fWork.fNAlloc = 0;
  uVar4 = lVar2 * lVar1;
  if (uVar4 != 0) {
    if ((long)uVar4 < 0x3e9) goto LAB_00ce4681;
    local_3f68 = (longdouble *)operator_new__(-(ulong)(uVar4 >> 0x3c != 0) | uVar4 * 0x10);
  }
  local_3f58.fElem = local_3f68;
LAB_00ce4681:
  local_3f58.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01885620;
  Gather(this,B,&local_3f58);
  iVar3 = TPZBlockDiagonal<long_double>::Substitution
                    (&this->super_TPZBlockDiagonal<long_double>,&local_3f58);
  (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])(B)
  ;
  Scatter(this,&local_3f58,B);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_3f58,&PTR_PTR_018858d8);
  return iVar3;
}

Assistant:

int TPZSparseBlockDiagonal<TVar>::Substitution(TPZFMatrix<TVar>* B) const
{
	TPZFNMatrix<1000,TVar > BG(fBlock.NElements(),B->Cols());
	Gather(*B,BG);
	int result = TPZBlockDiagonal<TVar>::Substitution(&BG);
	B->Zero();
	Scatter(BG,*B);
	return result;
	
}